

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

string * testing::TempDir_abi_cxx11_(void)

{
  char *__s;
  size_t sVar1;
  string *in_RDI;
  long lVar2;
  bool bVar3;
  char *local_58 [2];
  long *local_48;
  ulong local_40;
  long local_38 [2];
  
  local_58[0] = "TEST_TMPDIR";
  local_58[1] = "TMPDIR";
  bVar3 = false;
  lVar2 = 0;
  while ((__s = getenv(*(char **)((long)local_58 + lVar2)), __s == (char *)0x0 || (*__s == '\0'))) {
    lVar2 = lVar2 + 8;
    bVar3 = lVar2 == 0x10;
    if (bVar3) {
LAB_001351cf:
      (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
      *(undefined4 *)&in_RDI->field_2 = 0x706d742f;
      *(undefined2 *)((long)&in_RDI->field_2 + 4) = 0x2f;
      in_RDI->_M_string_length = 5;
      return in_RDI;
    }
  }
  sVar1 = strlen(__s);
  if (__s[sVar1 - 1] == '/') {
    (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
    strlen(__s);
    std::__cxx11::string::_M_construct<char_const*>();
  }
  else {
    local_48 = local_38;
    sVar1 = strlen(__s);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,__s,__s + sVar1);
    std::__cxx11::string::_M_replace_aux((ulong)&local_48,local_40,0,'\x01');
    (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
    std::__cxx11::string::_M_construct<char*>();
    if (local_48 != local_38) {
      operator_delete(local_48,local_38[0] + 1);
    }
  }
  if (!bVar3) {
    return in_RDI;
  }
  goto LAB_001351cf;
}

Assistant:

std::string TempDir() {
#if defined(GTEST_CUSTOM_TEMPDIR_FUNCTION_)
  return GTEST_CUSTOM_TEMPDIR_FUNCTION_();
#elif GTEST_OS_WINDOWS || GTEST_OS_WINDOWS_MOBILE
  return GetTempDirFromEnv({"TEST_TMPDIR", "TEMP"}, "\\temp\\", '\\');
#elif GTEST_OS_LINUX_ANDROID
  return GetTempDirFromEnv({"TEST_TMPDIR", "TMPDIR"}, "/data/local/tmp/", '/');
#else
  return GetTempDirFromEnv({"TEST_TMPDIR", "TMPDIR"}, "/tmp/", '/');
#endif
}